

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_treenode.cc
# Opt level: O0

void __thiscall dh::TreeNode::TreeNode(TreeNode *this,float *val,int lineno)

{
  shared_ptr<dh::TreeNode> local_40 [2];
  int local_1c;
  float *pfStack_18;
  int lineno_local;
  float *val_local;
  TreeNode *this_local;
  
  local_1c = lineno;
  pfStack_18 = val;
  val_local = (float *)this;
  std::vector<std::shared_ptr<dh::TreeNode>,_std::allocator<std::shared_ptr<dh::TreeNode>_>_>::
  vector(&this->_children);
  std::shared_ptr<dh::TreeNode>::shared_ptr(&this->_sibling);
  std::__cxx11::string::string((string *)&this->strval);
  boost::
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_float>
  ::variant(&this->_data);
  boost::variant<std::__cxx11::string,int,float>::operator=
            ((variant<std::__cxx11::string,int,float> *)&this->_data,pfStack_18);
  std::shared_ptr<dh::TreeNode>::shared_ptr(local_40,(nullptr_t)0x0);
  std::shared_ptr<dh::TreeNode>::operator=(&this->_sibling,local_40);
  std::shared_ptr<dh::TreeNode>::~shared_ptr(local_40);
  this->_lineno = local_1c;
  this->_type = -1;
  this->_nodekind = -1;
  this->_kind = -1;
  return;
}

Assistant:

TreeNode::TreeNode( const float& val, int lineno)
{
	this->_data = val;
	this->_sibling = nullptr;
	this->_lineno = lineno;
	this->_type = -1;
	this->_nodekind = -1;
	this->_kind = -1;
}